

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textSubtitles.cpp
# Opt level: O2

long __thiscall
text_subtitles::TextToPGSConverter::composeObjectDefinition
          (TextToPGSConverter *this,uint8_t *buff,int64_t pts,int64_t dts,int firstLine,int lastLine
          ,bool needPgHeader)

{
  uint8_t *buffer;
  uint8_t *puVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  uint8_t *__dest;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> seqPos;
  uint8_t *local_80;
  uint local_78;
  int local_74;
  uint8_t *local_70;
  _Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> local_68;
  uint8_t *local_50;
  int64_t local_48;
  int64_t local_40;
  uint8_t *local_38;
  
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = this->m_renderedData;
  local_78 = (lastLine - firstLine) + 1U & 0xffff;
  iVar5 = 0;
  iVar3 = 0;
  local_80 = buff;
  local_70 = buff;
  local_50 = buff;
  local_48 = pts;
  local_40 = dts;
  do {
    if (needPgHeader) {
      writePGHeader(local_80,local_48,local_40);
      local_80 = local_80 + 10;
    }
    buffer = local_80 + 1;
    *local_80 = '\x15';
    local_80[3] = '\0';
    puVar1 = local_80 + 5;
    local_80[4] = '\0';
    local_80 = local_80 + 6;
    *puVar1 = '\0';
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
              ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&local_68,&local_80);
    puVar1 = local_80 + 1;
    *local_80 = '\0';
    iVar2 = 0xffeb;
    local_74 = iVar3 + -1;
    __dest = puVar1;
    if (iVar3 == 0) {
      local_80 = local_80 + 4;
      AV_WB16(local_80,this->m_videoWidth);
      local_80 = local_80 + 2;
      AV_WB16(local_80,(uint16_t)local_78);
      iVar2 = 0xffe4;
      __dest = local_80 + 2;
      local_70 = puVar1;
    }
    iVar3 = this->m_rleLen - iVar5;
    if (iVar2 <= iVar3) {
      iVar3 = iVar2;
    }
    local_80 = __dest;
    memcpy(__dest,local_38 + iVar5,(long)iVar3);
    local_80 = local_80 + iVar3;
    AV_WB16(buffer,(short)local_80 - ((short)buffer + 2));
    iVar5 = iVar5 + iVar3;
    iVar3 = local_74;
  } while (iVar5 < this->m_rleLen);
  AV_WB24(local_70,this->m_rleLen + 4);
  if (local_68._M_impl.super__Vector_impl_data._M_start !=
      local_68._M_impl.super__Vector_impl_data._M_finish) {
    **local_68._M_impl.super__Vector_impl_data._M_start =
         **local_68._M_impl.super__Vector_impl_data._M_start | 0x80;
    *local_68._M_impl.super__Vector_impl_data._M_finish[-1] =
         *local_68._M_impl.super__Vector_impl_data._M_finish[-1] | 0x40;
  }
  lVar4 = (long)local_80 - (long)local_50;
  std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base(&local_68);
  return lVar4;
}

Assistant:

long TextToPGSConverter::composeObjectDefinition(uint8_t* buff, const int64_t pts, const int64_t dts,
                                                 const int firstLine, const int lastLine, const bool needPgHeader) const
{
    std::vector<uint8_t*> seqPos;

    const uint8_t* srcData = m_renderedData;
    int srcProcessed = 0;
    int blocks = 0;
    uint8_t* curPos = buff;
    uint8_t* sizePos = buff;
    do
    {
        if (needPgHeader)
            curPos += writePGHeader(curPos, pts, dts);
        *curPos++ = OBJECT_DEF_SEGMENT;
        curPos += 2;  // skip length field
        uint8_t* fragmentStart = curPos;
        *curPos++ = 0;  // objectID
        *curPos++ = 0;  // objectID
        *curPos++ = 0;  // object version number
        seqPos.push_back(curPos);
        *curPos++ = 0;  // 0xc0; // sequence descriptor: first=true, last=true

        if (blocks == 0)
        {
            sizePos = curPos;
            // object data header
            curPos += 3;  // skip total size
            AV_WB16(curPos, m_videoWidth);
            curPos += 2;
            AV_WB16(curPos, static_cast<uint16_t>(lastLine - firstLine + 1));
            curPos += 2;
        }

        int MAX_PG_PACKET = 65515;
        if (blocks == 0)
            MAX_PG_PACKET -= 7;
        const int size = FFMIN(m_rleLen - srcProcessed, MAX_PG_PACKET);
        memcpy(curPos, srcData + srcProcessed, size);
        srcProcessed += size;
        curPos += size;

        AV_WB16(fragmentStart - 2, static_cast<uint16_t>(curPos - fragmentStart));  // correct length field
        blocks++;
    } while (srcProcessed < m_rleLen);
    AV_WB24(sizePos, m_rleLen + 4);  // object len
    if (!seqPos.empty())
    {
        *(seqPos[0]) |= 0x80;
        *(seqPos[seqPos.size() - 1]) |= 0x40;
    }
    return static_cast<long>(curPos - buff);
}